

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O2

bool phyr::solveQuadraticSystem(FPError a,FPError b,FPError c,FPError *t1,FPError *t2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  FPError local_b8;
  double local_a0;
  FPError local_98;
  FPError local_78;
  FPError local_60;
  FPError local_48;
  
  t1->v = 2.2250738585072014e-308;
  t1->lBound = 2.2250738585072014e-308;
  t1->uBound = 2.2250738585072014e-308;
  t2->v = 1.79769313486232e+308;
  t2->lBound = 1.79769313486232e+308;
  t2->uBound = 1.79769313486232e+308;
  FPError::operator*(&local_b8,&b,&b);
  operator*(&local_98,4.0,&a);
  FPError::operator*(&local_78,&local_98,&c);
  FPError::operator-(&local_60,&local_b8,&local_78);
  operator*(&local_78,2.0,&a);
  uVar5 = SUB84(local_60.v,0);
  uVar6 = (undefined4)((ulong)local_60.v >> 0x20);
  if (0.0 <= local_60.v) {
    local_a0 = local_60.v;
    if ((local_60.v != 0.0) || (NAN(local_60.v))) {
      if (local_60.v < 0.0) {
        local_60.v = sqrt(local_60.v);
      }
      else {
        local_60.v = SQRT(local_60.v);
      }
      local_48.v._4_4_ = b.v._4_4_ ^ 0x80000000;
      local_48.lBound._4_4_ = b.lBound._4_4_ ^ 0x80000000;
      local_48.v._0_4_ = b.v._0_4_;
      local_48.lBound._0_4_ = b.lBound._0_4_;
      local_48.uBound = -(double)CONCAT44(b.uBound._4_4_,b.uBound._0_4_);
      local_60.lBound = local_60.v;
      local_60.uBound = local_60.v;
      FPError::operator-(&local_98,&local_48,&local_60);
      FPError::operator/(&local_b8,&local_98,&local_78);
      t1->uBound = local_b8.uBound;
      t1->v = local_b8.v;
      t1->lBound = local_b8.lBound;
      local_48.v._4_4_ = b.v._4_4_ ^ 0x80000000;
      local_48.lBound._4_4_ = b.lBound._4_4_ ^ 0x80000000;
      local_48.v._0_4_ = b.v._0_4_;
      local_48.lBound._0_4_ = b.lBound._0_4_;
      local_48.uBound = -(double)CONCAT44(b.uBound._4_4_,b.uBound._0_4_);
      FPError::operator+(&local_98,&local_48,&local_60);
      FPError::operator/(&local_b8,&local_98,&local_78);
      t2->uBound = local_b8.uBound;
      t2->v = local_b8.v;
      t2->lBound = local_b8.lBound;
    }
    else {
      local_98.uBound._4_4_ = b.uBound._4_4_ ^ 0x80000000;
      local_98.v._4_4_ = b.v._4_4_ ^ 0x80000000;
      local_98.lBound._4_4_ = b.lBound._4_4_ ^ 0x80000000;
      local_98.v._0_4_ = b.v._0_4_;
      local_98.lBound._0_4_ = b.lBound._0_4_;
      local_98.uBound._0_4_ = b.uBound._0_4_;
      FPError::operator/(&local_b8,&local_98,&local_78);
      t1->uBound = local_b8.uBound;
      t1->v = local_b8.v;
      t1->lBound = local_b8.lBound;
    }
    uVar5 = SUB84(local_a0,0);
    uVar6 = (undefined4)((ulong)local_a0 >> 0x20);
    if (t2->v <= t1->v && t1->v != t2->v) {
      dVar1 = t1->uBound;
      dVar2 = t1->v;
      dVar3 = t1->lBound;
      t1->uBound = t2->uBound;
      dVar4 = t2->lBound;
      t1->v = t2->v;
      t1->lBound = dVar4;
      t2->uBound = dVar1;
      t2->v = dVar2;
      t2->lBound = dVar3;
    }
  }
  return 0.0 < (double)CONCAT44(uVar6,uVar5) || (double)CONCAT44(uVar6,uVar5) == 0.0;
}

Assistant:

inline bool solveQuadraticSystem(FPError a, FPError b, FPError c, FPError* t1, FPError* t2) {
    // Default improbable solutions
    *t1 = MinReal; *t2 = MaxReal;

    FPError det = b*b - 4*a*c, den = 2 * a;
    // No real solutions exist
    if (Real(det) < 0) return false;
    // Single solution
    else if (Real(det) == 0) { *t1 = -b / den; }
    // Two solutions
    else {
        det = std::sqrt(Real(det));
        *t1 = (-b - det) / den; *t2 = (-b + det) / den;
    }

    if (Real(*t1) > Real(*t2)) std::swap(*t1, *t2);
    return true;
}